

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,4ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *attr,string *name,
          uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  byte bVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  uint32_t indent_00;
  ulong uVar8;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  long lVar9;
  byte bVar10;
  char *pcVar11;
  byte bVar12;
  array<float,_4UL> a;
  stringstream ss;
  string local_258;
  string *local_238;
  uint32_t local_22c;
  tinyusdz local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  size_type sStack_218;
  undefined2 local_210;
  TypedTimeSamples<std::array<float,_4UL>_> local_208;
  TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_238 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x228];
  local_1e0 = __return_storage_ptr__;
  if (tVar2 == (tinyusdz)0x0) {
    uVar8 = *(ulong *)(this + 0x218);
    if (uVar8 == *(ulong *)(this + 0x210)) {
      if ((this[0x208] == (tinyusdz)0x0) && (((byte)this[0x268] & 1) == 0)) goto LAB_0030d9a9;
      bVar10 = ((byte)this[0x268] ^ 1) & (byte)this[0x208];
      bVar3 = 0;
      local_228 = tVar2;
    }
    else {
      bVar3 = 1;
      bVar10 = 0;
      local_228 = tVar2;
    }
  }
  else {
    local_220 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(this + 0x230);
    sStack_218 = *(size_type *)(this + 0x238);
    local_210 = *(undefined2 *)(this + 0x240);
    local_228 = tVar2;
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
    ::vector(&local_208._samples,
             (vector<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
              *)(this + 0x248));
    local_208._dirty = *(bool *)(this + 0x260);
    uVar8 = CONCAT71((int7)((ulong)name >> 8),local_208._dirty);
    bVar3 = 0;
    bVar10 = 0;
  }
  indent_00 = (uint32_t)uVar8;
  if (((byte)local_228 & 1) == 0) {
    bVar12 = 0;
    local_22c = 0;
  }
  else {
    bVar12 = (byte)local_210;
    if ((uVar8 & 1) != 0) {
      TypedTimeSamples<std::array<float,_4UL>_>::update(&local_208);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_208._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_208._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_208._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_22c = indent_00;
  }
  if (((((byte)local_228 & 1) == 0) || (local_210._1_1_ != '\0')) || ((byte)local_210 != '\0')) {
    bVar6 = false;
  }
  else {
    bVar6 = local_208._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_208._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar5 = AttrMetas::authored((AttrMetas *)this);
  if (((bVar5) || (!(bool)(bVar3 | bVar6))) ||
     (n_01 = n, ((bVar10 | (byte)this[0x268] | bVar12) & 1) != 0)) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)local_238,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_258.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_258._M_string_length = 6;
    local_258.field_2._M_local_buf[6] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (this[0x268] == (tinyusdz)0x1) {
      pcVar11 = " = None";
      lVar9 = 7;
LAB_0030d635:
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,lVar9);
    }
    else if (bVar12 != 0) {
      if (local_228 == (tinyusdz)0x0) goto LAB_0030da02;
      if ((local_210._1_1_ != '\0') || ((byte)local_210 != '\x01')) {
        pcVar11 = " = [InternalError]";
        lVar9 = 0x12;
        goto LAB_0030d635;
      }
      local_258._M_dataplus._M_p = (pointer)local_220;
      local_258._M_string_length = sStack_218;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      ::std::operator<<(local_1a8,(float4 *)&local_258);
    }
    bVar6 = AttrMetas::authored((AttrMetas *)this);
    if (bVar6) {
      local_1e8 = attr;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      psVar4 = local_238;
      print_attr_metas_abi_cxx11_(&local_258,this,(AttrMeta *)(ulong)((int)local_238 + 1),indent_00)
      ;
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)psVar4 & 0xffffffff),n_00);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      attr = local_1e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT17(local_258.field_2._M_local_buf[7],
                                 CONCAT16(local_258.field_2._M_local_buf[6],
                                          CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                   local_258.field_2._M_allocated_capacity._0_4_)))
                        + 1);
        attr = local_1e8;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_22c != '\0') {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)local_238,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_258.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_258._M_string_length = 6;
    local_258.field_2._M_local_buf[6] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_228 == (tinyusdz)0x0) {
LAB_0030da02:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float, 4>>>::value() const [T = tinyusdz::Animatable<std::array<float, 4>>]"
                   );
    }
    print_typed_timesamples<std::array<float,4ul>>
              (&local_258,(tinyusdz *)&local_208,
               (TypedTimeSamples<std::array<float,_4UL>_> *)local_238,indent_00);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)local_238,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length);
    paVar1 = &local_258.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_258.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_258.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_258._M_string_length = 6;
    local_258.field_2._M_local_buf[6] = '\0';
    local_258._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT17(local_258.field_2._M_local_buf[7],
                               CONCAT16(local_258.field_2._M_local_buf[6],
                                        CONCAT24(local_258.field_2._M_allocated_capacity._4_2_,
                                                 local_258.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar9 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar9 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar9 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if ((local_228 == (tinyusdz)0x1) &&
     (local_208._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_208._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_4UL>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0030d9a9:
  psVar4 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}